

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

bool __thiscall
sf::priv::WindowImplX11::checkXRandR(WindowImplX11 *this,int *xRandRMajor,int *xRandRMinor)

{
  int iVar1;
  ostream *poVar2;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  int version;
  undefined1 local_24 [4];
  int *local_20;
  int *local_18;
  bool local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = XQueryExtension(*(undefined8 *)(in_RDI + 0x3d0),"RANDR",local_24,local_24);
  if (iVar1 == 0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"XRandR extension is not supported");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  else {
    iVar1 = XRRQueryVersion(*(undefined8 *)(in_RDI + 0x3d0),local_18,local_20);
    if (((iVar1 == 0) || (*local_18 < 1)) || ((*local_18 == 1 && (*local_20 < 2)))) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"XRandR is too old");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool WindowImplX11::checkXRandR(int& xRandRMajor, int& xRandRMinor)
{
    // Check if the XRandR extension is present
    int version;
    if (!XQueryExtension(m_display, "RANDR", &version, &version, &version))
    {
        err() << "XRandR extension is not supported" << std::endl;
        return false;
    }

    // Check XRandR version, 1.2 required
    if (!XRRQueryVersion(m_display, &xRandRMajor, &xRandRMinor) || xRandRMajor < 1 || (xRandRMajor == 1 && xRandRMinor < 2 ))
    {
        err() << "XRandR is too old" << std::endl;
        return false;
    }

    return true;
}